

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance
          (RandomAllocFreeTestInstance *this)

{
  bool bVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  ulong local_38;
  size_t objectNdx;
  Heap *heap;
  deUint32 heapNdx;
  DeviceInterface *vkd;
  VkDevice device;
  RandomAllocFreeTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__RandomAllocFreeTestInstance_016666d0;
  pVVar2 = vkt::Context::getDevice((this->super_TestInstance).m_context);
  pDVar3 = vkt::Context::getDeviceInterface((this->super_TestInstance).m_context);
  heap._4_4_ = 0;
  while( true ) {
    sVar4 = std::
            vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
            ::size(&this->m_heaps);
    if ((uint)sVar4 <= heap._4_4_) break;
    pvVar5 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,(ulong)heap._4_4_);
    local_38 = 0;
    while( true ) {
      sVar4 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ::size(&pvVar5->objects);
      if (sVar4 <= local_38) break;
      pvVar6 = std::
               vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
               ::operator[](&pvVar5->objects,local_38);
      bVar1 = ::vk::Handle<(vk::HandleType)7>::operator!(&pvVar6->memory);
      if (!bVar1) {
        pvVar6 = std::
                 vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                 ::operator[](&pvVar5->objects,local_38);
        (*pDVar3->_vptr_DeviceInterface[6])(pDVar3,pVVar2,(pvVar6->memory).m_internal,0);
      }
      local_38 = local_38 + 1;
    }
    heap._4_4_ = heap._4_4_ + 1;
  }
  std::
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  ::~vector(&this->m_heaps);
  de::Random::~Random(&this->m_rng);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance (void)
{
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	for (deUint32 heapNdx = 0; heapNdx < (deUint32)m_heaps.size(); heapNdx++)
	{
		const Heap&	heap	= m_heaps[heapNdx];

		for (size_t objectNdx = 0; objectNdx < heap.objects.size(); objectNdx++)
		{
			if (!!heap.objects[objectNdx].memory)
				vkd.freeMemory(device, heap.objects[objectNdx].memory, (const VkAllocationCallbacks*)DE_NULL);
		}
	}
}